

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall Catch::AssertionResult::getExpressionInMacro_abi_cxx11_(AssertionResult *this)

{
  bool bVar1;
  string *in_RSI;
  string *in_RDI;
  string *expr;
  string *rhs;
  string local_38 [16];
  StringRef *in_stack_ffffffffffffffd8;
  
  rhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = StringRef::empty((StringRef *)in_RSI);
  if (bVar1) {
    StringRef::operator_cast_to_string(in_stack_ffffffffffffffd8);
    std::__cxx11::string::operator=((string *)in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
  }
  else {
    StringRef::size((StringRef *)in_RSI);
    StringRef::size((StringRef *)(in_RSI + 1));
    std::__cxx11::string::reserve((ulong)in_RDI);
    operator+=(in_RSI,(StringRef *)rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,"( ");
    operator+=(in_RSI,(StringRef *)rhs);
    std::__cxx11::string::operator+=((string *)in_RDI," )");
  }
  return rhs;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
        std::string expr;
        if( m_info.macroName.empty() )
            expr = static_cast<std::string>(m_info.capturedExpression);
        else {
            expr.reserve( m_info.macroName.size() + m_info.capturedExpression.size() + 4 );
            expr += m_info.macroName;
            expr += "( ";
            expr += m_info.capturedExpression;
            expr += " )";
        }
        return expr;
    }